

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-ping-pong.c
# Opt level: O3

void socketpair_pinger_new(int vectored_writes)

{
  int iVar1;
  uv_handle_type uVar2;
  pinger_t *pinger;
  uv_loop_t *puVar3;
  uv_tcp_t *tcp;
  anon_union_232_2_629321f6_for_stream *tcp_00;
  int64_t eval_b;
  int64_t eval_a;
  uv_os_sock_t fds [2];
  uv_os_fd_t local_30;
  uv_os_fd_t local_2c;
  
  pinger = (pinger_t *)malloc(0x168);
  if (pinger == (pinger_t *)0x0) {
    socketpair_pinger_new_cold_11();
LAB_001abaa5:
    socketpair_pinger_new_cold_1();
LAB_001abab4:
    socketpair_pinger_new_cold_2();
LAB_001abac3:
    socketpair_pinger_new_cold_3();
LAB_001abad2:
    socketpair_pinger_new_cold_4();
LAB_001abae1:
    socketpair_pinger_new_cold_5();
LAB_001abaf0:
    socketpair_pinger_new_cold_10();
LAB_001abaf5:
    socketpair_pinger_new_cold_6();
LAB_001abb04:
    socketpair_pinger_new_cold_7();
  }
  else {
    pinger->vectored_writes = vectored_writes;
    pinger->pongs = 0;
    pinger->state = 0;
    pinger->pong = PONG;
    uv_default_loop();
    iVar1 = uv_socketpair(1,0,&local_30,0x40,0x40);
    if (iVar1 != 0) goto LAB_001abaa5;
    uVar2 = uv_guess_handle(local_30);
    if (uVar2 != UV_NAMED_PIPE) goto LAB_001abab4;
    uVar2 = uv_guess_handle(local_2c);
    if (uVar2 != UV_NAMED_PIPE) goto LAB_001abac3;
    puVar3 = uv_default_loop();
    tcp_00 = &pinger->stream;
    iVar1 = uv_tcp_init(puVar3,&tcp_00->tcp);
    if (iVar1 != 0) goto LAB_001abad2;
    (pinger->stream).tcp.data = pinger;
    iVar1 = uv_tcp_open(&tcp_00->tcp,local_2c);
    if (iVar1 != 0) goto LAB_001abae1;
    tcp = (uv_tcp_t *)malloc(0xd8);
    if (tcp == (uv_tcp_t *)0x0) goto LAB_001abaf0;
    tcp->data = (void *)0x0;
    puVar3 = uv_default_loop();
    iVar1 = uv_tcp_init(puVar3,tcp);
    if (iVar1 != 0) goto LAB_001abaf5;
    iVar1 = uv_tcp_open(tcp,local_30);
    if (iVar1 != 0) goto LAB_001abb04;
    pinger_write_ping(pinger);
    iVar1 = uv_read_start((uv_stream_t *)&tcp_00->tcp,alloc_cb,pinger_read_cb);
    if (iVar1 == 0) {
      iVar1 = uv_read_start((uv_stream_t *)tcp,alloc_cb,ponger_read_cb);
      if (iVar1 == 0) {
        return;
      }
      goto LAB_001abb22;
    }
  }
  socketpair_pinger_new_cold_8();
LAB_001abb22:
  socketpair_pinger_new_cold_9();
  tcp_pinger_new(1);
  run_ping_pong_test();
  completed_pingers = 0;
  socketpair_pinger_new(1);
  run_ping_pong_test();
  return;
}

Assistant:

static void socketpair_pinger_new(int vectored_writes) {
  pinger_t* pinger;
  uv_os_sock_t fds[2];
  uv_tcp_t* ponger;

  pinger = malloc(sizeof(*pinger));
  ASSERT_NOT_NULL(pinger);
  pinger->vectored_writes = vectored_writes;
  pinger->state = 0;
  pinger->pongs = 0;
  pinger->pong = PONG;

  /* Try to make a socketpair and do NUM_PINGS ping-pongs. */
  (void)uv_default_loop(); /* ensure WSAStartup has been performed */
  ASSERT_OK(uv_socketpair(SOCK_STREAM, 0, fds, UV_NONBLOCK_PIPE, UV_NONBLOCK_PIPE));
#ifndef _WIN32
  /* On Windows, this is actually a UV_TCP, but libuv doesn't detect that. */
  ASSERT_EQ(uv_guess_handle((uv_os_fd_t) fds[0]), UV_NAMED_PIPE);
  ASSERT_EQ(uv_guess_handle((uv_os_fd_t) fds[1]), UV_NAMED_PIPE);
#endif

  ASSERT_OK(uv_tcp_init(uv_default_loop(), &pinger->stream.tcp));
  pinger->stream.pipe.data = pinger;
  ASSERT_OK(uv_tcp_open(&pinger->stream.tcp, fds[1]));

  ponger = malloc(sizeof(*ponger));
  ASSERT_NOT_NULL(ponger);
  ponger->data = NULL;
  ASSERT_OK(uv_tcp_init(uv_default_loop(), ponger));
  ASSERT_OK(uv_tcp_open(ponger, fds[0]));

  pinger_write_ping(pinger);

  ASSERT_OK(uv_read_start((uv_stream_t*) &pinger->stream.tcp,
                          alloc_cb,
                          pinger_read_cb));
  ASSERT_OK(uv_read_start((uv_stream_t*) ponger,
                          alloc_cb,
                          ponger_read_cb));
}